

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> * __thiscall
testing::internal::
OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::GetAction
          (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
           *this)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }